

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vbox.cpp
# Opt level: O0

Element __thiscall ftxui::vbox(ftxui *this,Elements *children)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Element EVar1;
  vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_> local_28;
  Elements *children_local;
  
  local_28.
  super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)children;
  children_local = (Elements *)this;
  std::
  make_shared<ftxui::(anonymous_namespace)::VBox,std::vector<std::shared_ptr<ftxui::Node>,std::allocator<std::shared_ptr<ftxui::Node>>>>
            (&local_28);
  std::shared_ptr<ftxui::Node>::shared_ptr<ftxui::(anonymous_namespace)::VBox,void>
            ((shared_ptr<ftxui::Node> *)this,
             (shared_ptr<ftxui::(anonymous_namespace)::VBox> *)&local_28);
  std::shared_ptr<ftxui::(anonymous_namespace)::VBox>::~shared_ptr
            ((shared_ptr<ftxui::(anonymous_namespace)::VBox> *)&local_28);
  EVar1.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  EVar1.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (Element)EVar1.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Element vbox(Elements children) {
  return std::make_shared<VBox>(std::move(children));
}